

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

size_t TdokuSolverDpllTriadSimd
                 (char *puzzle,size_t limit,uint32_t configuration,char *solution,
                 size_t *num_guesses)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  undefined1 *puVar9;
  ulong uVar10;
  undefined1 *puVar11;
  uint uVar12;
  long lVar13;
  State *state;
  long lVar14;
  long lVar15;
  uint uVar16;
  char cVar17;
  undefined1 *puVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 local_520 [488];
  undefined8 auStack_338 [3];
  undefined1 auStack_320 [160];
  undefined8 auStack_280 [74];
  
  if (limit != 1 && configuration == 0) {
    puVar11 = local_520 + 0x1e0;
    lVar13 = 0;
    (anonymous_namespace)::solver_none._488_8_ = 0;
    (anonymous_namespace)::solver_none._496_8_ = 0;
    cVar17 = puzzle[0x51];
    do {
      lVar14 = 0x10;
      auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(auStack_320 + lVar13) = auVar26;
      auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])(local_520 + lVar13 + 0x1e0) = auVar26;
      do {
        *(undefined8 *)(puVar11 + lVar14 + -0x10) = 0x1ff01ff01ff01ff;
        *(undefined8 *)((long)(puVar11 + lVar14 + -0x10) + 8) = 0x1ff01ff;
        *(undefined8 *)(puVar11 + lVar14) = 0;
        *(undefined8 *)((long)(puVar11 + lVar14) + 8) = 0;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0x70);
      lVar13 = lVar13 + 0x60;
      puVar11 = puVar11 + 0x60;
    } while (lVar13 != 0xc0);
    lVar13 = 0xc0;
    do {
      *(undefined8 *)(local_520 + lVar13 + 0x1e0) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13 + 8) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)auStack_338 + lVar13 + 0x10) = 0x1ff01ff01ff01ff;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x1e0);
    (anonymous_namespace)::solver_none._480_8_ = limit;
    if (cVar17 < '.') {
      bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<0>::InitVanillaByBand
                         (puzzle,(State *)(local_520 + 0x1e0));
    }
    else {
      bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<0>::InitPencilmarkByBox
                         (puzzle,(State *)(local_520 + 0x1e0));
    }
    if (bVar19 == false) {
      sVar8 = 0;
    }
    else {
      anon_unknown.dwarf_44::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment
                ((SolverDpllTriadSimd<0> *)(anonymous_namespace)::solver_none,
                 (State *)(local_520 + 0x1e0));
      sVar8 = (anonymous_namespace)::solver_none._496_8_;
    }
    *num_guesses = sVar8;
    return (anonymous_namespace)::solver_none._488_8_;
  }
  puVar11 = local_520;
  lVar13 = 0;
  (anonymous_namespace)::solver_last._488_8_ = 0;
  (anonymous_namespace)::solver_last._496_8_ = 0;
  cVar17 = puzzle[0x51];
  do {
    lVar14 = 0x10;
    auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])(local_520 + lVar13 + 0x20) = auVar26;
    auVar26 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    *(undefined1 (*) [64])(local_520 + lVar13) = auVar26;
    do {
      *(undefined8 *)(puVar11 + lVar14 + -0x10) = 0x1ff01ff01ff01ff;
      *(undefined8 *)((long)(puVar11 + lVar14 + -0x10) + 8) = 0x1ff01ff;
      *(undefined8 *)(puVar11 + lVar14) = 0;
      *(undefined8 *)((long)(puVar11 + lVar14) + 8) = 0;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0x70);
    lVar13 = lVar13 + 0x60;
    puVar11 = puVar11 + 0x60;
  } while (lVar13 != 0xc0);
  lVar13 = 0xc0;
  do {
    *(undefined8 *)(local_520 + lVar13) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 8) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 0x10) = 0x1ff01ff01ff01ff;
    *(undefined8 *)(local_520 + lVar13 + 0x18) = 0x1ff01ff01ff01ff;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0x1e0);
  (anonymous_namespace)::solver_last._480_8_ = limit;
  if (cVar17 < '.') {
    auVar24[8] = 0x2e;
    auVar24._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar24[9] = 0x2e;
    auVar24[10] = 0x2e;
    auVar24[0xb] = 0x2e;
    auVar24[0xc] = 0x2e;
    auVar24[0xd] = 0x2e;
    auVar24[0xe] = 0x2e;
    auVar24[0xf] = 0x2e;
    auVar24[0x10] = 0x2e;
    auVar24[0x11] = 0x2e;
    auVar24[0x12] = 0x2e;
    auVar24[0x13] = 0x2e;
    auVar24[0x14] = 0x2e;
    auVar24[0x15] = 0x2e;
    auVar24[0x16] = 0x2e;
    auVar24[0x17] = 0x2e;
    auVar24[0x18] = 0x2e;
    auVar24[0x19] = 0x2e;
    auVar24[0x1a] = 0x2e;
    auVar24[0x1b] = 0x2e;
    auVar24[0x1c] = 0x2e;
    auVar24[0x1d] = 0x2e;
    auVar24[0x1e] = 0x2e;
    auVar24[0x1f] = 0x2e;
    uVar5 = vpcmpeqb_avx512vl(auVar24,*(undefined1 (*) [32])(puzzle + 0x20));
    uVar4 = vpcmpeqb_avx512vl(auVar24,*(undefined1 (*) [32])puzzle);
    uVar10 = CONCAT44((int)uVar5,(int)uVar4);
    if (uVar10 != 0xffffffffffffffff) {
      uVar10 = ~uVar10;
      do {
        lVar13 = 0;
        for (uVar2 = uVar10; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        bVar1 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1901];
        auVar24 = vandnps_avx(*(undefined1 (*) [32])
                               ((anonymous_namespace)::tables +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1905] *
                               0x20 + ((long)puzzle[lVar13] + -0x31) * 0x200),
                              *(undefined1 (*) [32])
                               (local_520 +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] *
                               0x20 + 0xc0));
        lVar14 = (ulong)bVar1 * 0x20;
        *(undefined1 (*) [32])
         (local_520 + (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] * 0x20 + 0xc0)
             = auVar24;
        auVar20 = vpbroadcastw_avx512vl();
        lVar15 = (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1900] * 0x20;
        uVar10 = uVar10 - 1 & uVar10;
        auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1903] * 0x10 +
                                       (ulong)bVar1 * 0x40 + 0x10c3a0),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar15 + 0x10),0xea);
        auVar22 = *(undefined1 (*) [16])
                   ((ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1904] * 0x10 +
                   (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1900] * 0x40 + 0x10c3a0
                   );
        *(undefined1 (*) [16])(local_520 + lVar15 + 0x10) = auVar21;
        auVar22 = vpternlogd_avx512vl(auVar22,auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x70),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x70) = auVar22;
      } while (uVar10 != 0);
    }
    auVar22[8] = 0x2e;
    auVar22._0_8_ = 0x2e2e2e2e2e2e2e2e;
    auVar22[9] = 0x2e;
    auVar22[10] = 0x2e;
    auVar22[0xb] = 0x2e;
    auVar22[0xc] = 0x2e;
    auVar22[0xd] = 0x2e;
    auVar22[0xe] = 0x2e;
    auVar22[0xf] = 0x2e;
    uVar5 = vpcmpeqb_avx512vl(auVar22,*(undefined1 (*) [16])(puzzle + 0x40));
    if ((short)uVar5 != -1) {
      uVar7 = ~(uint)uVar5 & 0xffff;
      do {
        uVar12 = 0;
        for (uVar16 = uVar7; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x80000000) {
          uVar12 = uVar12 + 1;
        }
        lVar13 = (ulong)uVar12 + 0x40;
        bVar1 = (anonymous_namespace)::tables[lVar13 * 6 + 0x1901];
        auVar24 = vandnps_avx(*(undefined1 (*) [32])
                               ((anonymous_namespace)::tables +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1905] *
                               0x20 + ((long)puzzle[(ulong)uVar12 + 0x40] + -0x31) * 0x200),
                              *(undefined1 (*) [32])
                               (local_520 +
                               (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] *
                               0x20 + 0xc0));
        lVar14 = (ulong)bVar1 * 0x20;
        *(undefined1 (*) [32])
         (local_520 + (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1902] * 0x20 + 0xc0)
             = auVar24;
        auVar20 = vpbroadcastw_avx512vl();
        lVar15 = (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1900] * 0x20;
        uVar7 = uVar7 - 1 & uVar7;
        auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                       ((ulong)(byte)(anonymous_namespace)::tables
                                                     [lVar13 * 6 + 0x1903] * 0x10 +
                                       (ulong)bVar1 * 0x40 + 0x10c3a0),auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar15 + 0x10),0xea);
        auVar22 = *(undefined1 (*) [16])
                   ((ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1904] * 0x10 +
                   (ulong)(byte)(anonymous_namespace)::tables[lVar13 * 6 + 0x1900] * 0x40 + 0x10c3a0
                   );
        *(undefined1 (*) [16])(local_520 + lVar15 + 0x10) = auVar21;
        auVar22 = vpternlogd_avx512vl(auVar22,auVar20,
                                      *(undefined1 (*) [16])(local_520 + lVar14 + 0x70),0xea);
        *(undefined1 (*) [16])(local_520 + lVar14 + 0x70) = auVar22;
      } while (uVar7 != 0);
    }
    if ((long)puzzle[0x50] != 0x2e) {
      auVar20 = vpbroadcastw_avx512vl();
      auVar24 = vpandn_avx2(*(undefined1 (*) [32])
                             ((anonymous_namespace)::tables +
                             (ulong)(anonymous_namespace)::tables[0x1ae5] * 0x20 +
                             ((long)puzzle[0x50] + -0x31) * 0x200),
                            *(undefined1 (*) [32])
                             (local_520 + (ulong)(anonymous_namespace)::tables[0x1ae2] * 0x20 + 0xc0
                             ));
      *(undefined1 (*) [32])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae2] * 0x20 + 0xc0)
           = auVar24;
      auVar21 = vpternlogd_avx512vl(*(undefined1 (*) [16])
                                     ((ulong)(anonymous_namespace)::tables[0x1ae3] * 0x10 +
                                     (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x40 + 0x10c3a0)
                                    ,auVar20,*(undefined1 (*) [16])
                                              (local_520 +
                                              (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x20 +
                                              0x10),0xea);
      auVar22 = *(undefined1 (*) [16])
                 ((ulong)(anonymous_namespace)::tables[0x1ae4] * 0x10 +
                 (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x40 + 0x10c3a0);
      *(undefined1 (*) [16])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae0] * 0x20 + 0x10)
           = auVar21;
      auVar22 = vpternlogd_avx512vl(auVar22,auVar20,
                                    *(undefined1 (*) [16])
                                     (local_520 +
                                     (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x20 + 0x70),
                                    0xea);
      *(undefined1 (*) [16])(local_520 + (ulong)(anonymous_namespace)::tables[0x1ae1] * 0x20 + 0x70)
           = auVar22;
    }
    bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<0>((State *)local_520,0,1)
    ;
    sVar8 = 0;
    if (!bVar19) goto LAB_0010347d;
    bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<1>((State *)local_520,0,1)
    ;
    sVar8 = 0;
    if (!bVar19) goto LAB_0010347d;
    bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<0>((State *)local_520,1,2)
    ;
    if ((!bVar19) ||
       (bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<1>
                           ((State *)local_520,1,2), !bVar19)) {
LAB_0010347b:
      sVar8 = 0;
      goto LAB_0010347d;
    }
    bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<0>((State *)local_520,2,0)
    ;
    sVar8 = 0;
    if (!bVar19) goto LAB_0010347d;
    state = (State *)0x2;
    bVar19 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BandEliminate<1>((State *)local_520,2,0)
    ;
    sVar8 = 0;
    if (!bVar19) goto LAB_0010347d;
  }
  else {
    puVar11 = local_520 + 0x1e0;
    memcpy(puVar11,puzzle,0x2d9);
    auVar26 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(0x2e,
                                                  CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
    uVar10 = 0;
    bVar19 = false;
    do {
      lVar13 = 0;
      puVar18 = puVar11;
      do {
        auVar25 = ZEXT3264(CONCAT230(0x1ff,CONCAT228(0x1ff,CONCAT226(0x1ff,CONCAT224(0x1ff,CONCAT222
                                                  (0x1ff,CONCAT220(0x1ff,CONCAT218(0x1ff,CONCAT216(
                                                  0x1ff,CONCAT214(0x1ff,CONCAT212(0x1ff,CONCAT210(
                                                  0x1ff,CONCAT28(0x1ff,0x1ff01ff01ff01ff))))))))))))
                          );
        uVar7 = 0;
        lVar14 = 0;
        puVar9 = puVar18;
        do {
          lVar15 = 0;
          uVar12 = uVar7;
          do {
            if (0xf < uVar12) goto LAB_00102de8;
            uVar5 = vpcmpb_avx512vl(auVar26._0_16_,*(undefined1 (*) [16])(puVar9 + lVar15),4);
            uVar16 = (uint)uVar5 & 0x1ff;
            auVar22 = auVar25._0_16_;
            auVar24 = auVar25._0_32_;
            switch(uVar12) {
            case 0:
              auVar22 = vpinsrw_avx(auVar22,uVar16,0);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 1:
              auVar22 = vpinsrw_avx(auVar22,uVar16,1);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 2:
              auVar22 = vpinsrw_avx(auVar22,uVar16,2);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 3:
              auVar22 = vpinsrw_avx(auVar22,uVar16,3);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 4:
              auVar22 = vpinsrw_avx(auVar22,uVar16,4);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 5:
              auVar22 = vpinsrw_avx(auVar22,uVar16,5);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 6:
              auVar22 = vpinsrw_avx(auVar22,uVar16,6);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 7:
              auVar22 = vpinsrw_avx(auVar22,uVar16,7);
              auVar23 = ZEXT1632(auVar22);
              break;
            case 8:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,1);
              goto LAB_00102de2;
            case 9:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,2);
              goto LAB_00102de2;
            case 10:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,4);
              goto LAB_00102de2;
            case 0xb:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,8);
              goto LAB_00102de2;
            case 0xc:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,0x10);
              goto LAB_00102de2;
            case 0xd:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,0x20);
              goto LAB_00102de2;
            case 0xe:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,0x40);
              goto LAB_00102de2;
            case 0xf:
              auVar23 = vpbroadcastw_avx512vl();
              auVar23 = vpblendw_avx2(auVar24,auVar23,0x80);
LAB_00102de2:
              auVar24 = vpblendd_avx2(auVar24,auVar23,0xf0);
              auVar25 = ZEXT3264(auVar24);
              goto LAB_00102de8;
            }
            auVar24 = vpblendd_avx2(auVar24,auVar23,0xf);
            auVar25 = ZEXT3264(auVar24);
LAB_00102de8:
            lVar15 = lVar15 + 9;
            uVar12 = uVar12 + 1;
          } while (lVar15 != 0x1b);
          lVar14 = lVar14 + 1;
          uVar7 = uVar7 + 4;
          puVar9 = puVar9 + 0x51;
        } while (lVar14 != 3);
        uVar7 = (int)lVar13 + (int)uVar10 * 3;
        state = (State *)(ulong)uVar7;
        bVar6 = anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BoxRestrict<0>
                          ((State *)local_520,uVar7,(Cells16 *)0x3);
        if (!bVar6) {
          if (bVar19) goto LAB_0010330b;
          goto LAB_0010347b;
        }
        auVar26 = ZEXT1664(CONCAT115(0x2e,CONCAT114(0x2e,CONCAT113(0x2e,CONCAT112(0x2e,CONCAT111(
                                                  0x2e,CONCAT110(0x2e,CONCAT19(0x2e,CONCAT18(0x2e,
                                                  0x2e2e2e2e2e2e2e2e)))))))));
        lVar13 = lVar13 + 1;
        puVar18 = puVar18 + 0x1b;
      } while (lVar13 != 3);
      bVar19 = 1 < uVar10;
      uVar10 = uVar10 + 1;
      puVar11 = puVar11 + 0xf3;
    } while (uVar10 != 3);
  }
LAB_0010330b:
  anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::CountSolutionsConsistentWithPartialAssignment
            ((SolverDpllTriadSimd<1> *)local_520,state);
  lVar13 = 0;
  do {
    uVar10 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 0xc0);
    uVar2 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 200);
    uVar3 = *(ulong *)((anonymous_namespace)::solver_last + lVar13 * 8 + 0xd0);
    lVar14 = (long)*(int *)((anonymous_namespace)::tables + lVar13 + 0x18dc) * 3 +
             (long)*(int *)((anonymous_namespace)::tables + lVar13 + 0x18b8) * 0x1b;
    cVar17 = '\0';
    for (uVar7 = (uint)uVar10; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if ((uint)uVar10 == 0) {
      cVar17 = '0';
    }
    solution[lVar14] = cVar17;
    cVar17 = '\0';
    uVar12 = (uint)(uVar10 >> 0x10);
    for (uVar7 = uVar12; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar12 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 1] = cVar17;
    cVar17 = '\0';
    for (uVar7 = (uint)(uVar10 >> 0x20); (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar10 >> 0x20 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 2] = cVar17;
    cVar17 = '\0';
    for (uVar7 = (uint)uVar2; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if ((uint)uVar2 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 9] = cVar17;
    cVar17 = '\0';
    uVar12 = (uint)(uVar2 >> 0x10);
    for (uVar7 = uVar12; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar12 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 10] = cVar17;
    cVar17 = '\0';
    for (uVar7 = (uint)(uVar2 >> 0x20); (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar2 >> 0x20 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 0xb] = cVar17;
    cVar17 = '\0';
    for (uVar7 = (uint)uVar3; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if ((uint)uVar3 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 0x12] = cVar17;
    cVar17 = '\0';
    uVar12 = (uint)(uVar3 >> 0x10);
    for (uVar7 = uVar12; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar12 == 0) {
      cVar17 = '0';
    }
    solution[lVar14 + 0x13] = cVar17;
    cVar17 = '\0';
    for (uVar7 = (uint)(uVar3 >> 0x20); (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x80000000) {
      cVar17 = cVar17 + '\x01';
    }
    cVar17 = cVar17 + '1';
    if (uVar3 >> 0x20 == 0) {
      cVar17 = '0';
    }
    lVar13 = lVar13 + 4;
    solution[lVar14 + 0x14] = cVar17;
    sVar8 = (anonymous_namespace)::solver_last._496_8_;
  } while (lVar13 != 0x24);
LAB_0010347d:
  *num_guesses = sVar8;
  return (anonymous_namespace)::solver_last._488_8_;
}

Assistant:

size_t TdokuSolverDpllTriadSimd(const char *puzzle, size_t limit,
                                uint32_t configuration,
                                char *solution, size_t *num_guesses) {
    bool return_last = limit == 1 || configuration > 0;
    if (return_last) {
        return solver_last.SolveSudoku(puzzle, limit, solution, num_guesses);
    } else {
        return solver_none.SolveSudoku(puzzle, limit, solution, num_guesses);
    }
}